

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O0

void Fraig_NodeRemoveFaninFanout(Fraig_Node_t *pFanin,Fraig_Node_t *pFanoutToRemove)

{
  Fraig_Node_t *local_58;
  Fraig_Node_t *local_50;
  Fraig_Node_t **local_48;
  Fraig_Node_t *local_40;
  Fraig_Node_t *local_38;
  Fraig_Node_t **local_30;
  Fraig_Node_t **ppFanList;
  Fraig_Node_t *pFanout2;
  Fraig_Node_t *pFanout;
  Fraig_Node_t *pFanoutToRemove_local;
  Fraig_Node_t *pFanin_local;
  
  local_30 = &pFanin->pFanPivot;
  pFanout2 = pFanin->pFanPivot;
  if (pFanout2 == (Fraig_Node_t *)0x0) {
    local_38 = (Fraig_Node_t *)0x0;
  }
  else {
    if ((Fraig_Node_t *)((ulong)pFanout2->p1 & 0xfffffffffffffffe) == pFanin) {
      local_40 = pFanout2->pFanFanin1;
    }
    else {
      local_40 = pFanout2->pFanFanin2;
    }
    local_38 = local_40;
  }
  ppFanList = (Fraig_Node_t **)local_38;
  while (pFanout2 != (Fraig_Node_t *)0x0) {
    if (pFanout2 != pFanoutToRemove) {
      *local_30 = pFanout2;
      if ((Fraig_Node_t *)((ulong)pFanout2->p1 & 0xfffffffffffffffe) == pFanin) {
        local_48 = &pFanout2->pFanFanin1;
      }
      else {
        local_48 = &pFanout2->pFanFanin2;
      }
      local_30 = local_48;
    }
    pFanout2 = (Fraig_Node_t *)ppFanList;
    if (ppFanList == (Fraig_Node_t **)0x0) {
      local_50 = (Fraig_Node_t *)0x0;
    }
    else {
      if ((Fraig_Node_t *)((ulong)ppFanList[4] & 0xfffffffffffffffe) == pFanin) {
        local_58 = ppFanList[0x12];
      }
      else {
        local_58 = ppFanList[0x13];
      }
      local_50 = local_58;
    }
    ppFanList = (Fraig_Node_t **)local_50;
  }
  *local_30 = (Fraig_Node_t *)0x0;
  return;
}

Assistant:

void Fraig_NodeRemoveFaninFanout( Fraig_Node_t * pFanin, Fraig_Node_t * pFanoutToRemove )
{
    Fraig_Node_t * pFanout, * pFanout2, ** ppFanList;
    // start the linked list of fanouts
    ppFanList = &pFanin->pFanPivot; 
    // go through the fanouts
    Fraig_NodeForEachFanoutSafe( pFanin, pFanout, pFanout2 )
    {
        // skip the fanout-to-remove
        if ( pFanout == pFanoutToRemove )
            continue;
        // add useful fanouts to the list
        *ppFanList = pFanout;
        ppFanList = Fraig_NodeReadNextFanoutPlace( pFanin, pFanout );
    }
    *ppFanList = NULL;
}